

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O0

void __thiscall
duckdb::MetaPipeline::MetaPipeline
          (MetaPipeline *this,Executor *executor_p,PipelineBuildState *state_p,
          optional_ptr<duckdb::PhysicalOperator,_true> sink_p,MetaPipelineType type_p)

{
  undefined8 in_RCX;
  MetaPipeline *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 in_R8B;
  
  enable_shared_from_this<duckdb::MetaPipeline>::enable_shared_from_this
            ((enable_shared_from_this<duckdb::MetaPipeline> *)0x98e94e);
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  *(MetaPipeline **)(in_RDI + 0x18) = in_RDX;
  optional_ptr<duckdb::Pipeline,_true>::optional_ptr
            ((optional_ptr<duckdb::Pipeline,_true> *)(in_RDI + 0x20));
  *(undefined8 *)(in_RDI + 0x28) = in_RCX;
  *(undefined1 *)(in_RDI + 0x30) = in_R8B;
  *(undefined1 *)(in_RDI + 0x31) = 0;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)0x98e994);
  ::std::
  unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
  ::unordered_map((unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
                   *)0x98e9a7);
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *)0x98e9bd);
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  ::std::
  unordered_set<std::reference_wrapper<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
  ::unordered_set((unordered_set<std::reference_wrapper<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
                   *)0x98e9de);
  ::std::
  unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::Pipeline_&,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::Pipeline_&>_>_>
  ::unordered_map((unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::Pipeline_&,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::Pipeline_&>_>_>
                   *)0x98e9f4);
  CreatePipeline(in_RDX);
  return;
}

Assistant:

MetaPipeline::MetaPipeline(Executor &executor_p, PipelineBuildState &state_p, optional_ptr<PhysicalOperator> sink_p,
                           MetaPipelineType type_p)
    : executor(executor_p), state(state_p), sink(sink_p), type(type_p), recursive_cte(false), next_batch_index(0) {
	CreatePipeline();
}